

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O1

int LZWEncode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint8_t *puVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long *plVar28;
  uint8_t *local_80;
  long local_68;
  
  puVar3 = tif->tif_data;
  if (puVar3 == (uint8_t *)0x0) {
LAB_002aea96:
    iVar7 = 0;
  }
  else {
    if (*(long *)(puVar3 + 0x120) == 0) {
      __assert_fail("sp->enc_hashtab != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                    ,0x46e,"int LZWEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
    }
    lVar21 = *(long *)(puVar3 + 0x108);
    uVar25 = *(ulong *)(puVar3 + 0x110);
    local_68 = *(long *)(puVar3 + 0xf8);
    uVar22 = *(ulong *)(puVar3 + 0x88);
    lVar27 = *(long *)(puVar3 + 0x90);
    uVar6 = (uint)*(ushort *)(puVar3 + 0x84);
    uVar20 = (uint)*(ushort *)(puVar3 + 0x82);
    uVar2 = *(ushort *)(puVar3 + 0x80);
    uVar15 = (uint)uVar2;
    puVar19 = tif->tif_rawcp;
    puVar4 = *(uint8_t **)(puVar3 + 0x118);
    uVar17 = *(uint *)(puVar3 + 0xf4);
    lVar10 = lVar27;
    local_80 = bp;
    if ((0 < cc) && ((uVar17 & 0xffff) == 0xffff)) {
      uVar8 = (ulong)uVar2;
      uVar22 = uVar22 << ((byte)uVar2 & 0x3f) | 0x100;
      lVar10 = lVar27 + uVar8 + -8;
      *puVar19 = (uint8_t)(uVar22 >> ((byte)lVar10 & 0x3f));
      if ((long)(lVar27 + uVar8) < 0x10) {
        puVar19 = puVar19 + 1;
      }
      else {
        lVar10 = lVar27 + uVar8 + -0x10;
        puVar19[1] = (uint8_t)(uVar22 >> ((byte)lVar10 & 0x3f));
        puVar19 = puVar19 + 2;
      }
      uVar25 = uVar25 + uVar8;
      uVar17 = (uint)*bp;
      local_80 = bp + 1;
      cc = cc + -1;
      lVar21 = lVar21 + 1;
    }
    lVar27 = lVar10;
    if (0 < cc) {
      do {
        lVar24 = *(long *)(puVar3 + 0x120);
        lVar16 = lVar21 << 8;
        lVar11 = 1;
        lVar14 = 0;
        uVar8 = (ulong)uVar17;
        while( true ) {
          lVar16 = lVar16 + 0x100;
          bVar1 = local_80[lVar14];
          uVar8 = uVar8 & 0xffff;
          lVar26 = (ulong)bVar1 * 0x1000 + uVar8;
          uVar13 = (uint)bVar1 << 5 ^ (uint)uVar8;
          plVar28 = (long *)(lVar24 + (ulong)(uVar13 << 4));
          lVar5 = *(long *)(lVar24 + (ulong)(uVar13 << 4));
          lVar10 = lVar27;
          if (lVar5 != lVar26) break;
          uVar8 = (ulong)*(ushort *)(plVar28 + 1);
          lVar14 = lVar14 + 1;
          lVar5 = lVar11 + cc;
          lVar11 = lVar11 + -1;
          if (lVar5 + -1 < 2) {
            lVar21 = lVar21 + lVar14;
            uVar17 = (uint)*(ushort *)(plVar28 + 1);
            goto LAB_002aeac3;
          }
        }
        uVar17 = (uint)bVar1;
        lVar11 = lVar21 + lVar14 + 1;
        if (-1 < lVar5) {
          iVar7 = uVar13 - 0x2329;
          if ((uint)bVar1 << 5 == (uint)uVar8) {
            iVar7 = -1;
          }
          do {
            uVar18 = uVar13 + iVar7;
            uVar13 = uVar13 + 0x2329 + iVar7;
            if (-1 < (int)uVar18) {
              uVar13 = uVar18;
            }
            plVar28 = (long *)(lVar24 + (long)(int)uVar13 * 0x10);
            lVar5 = *(long *)(lVar24 + (long)(int)uVar13 * 0x10);
            if (lVar5 == lVar26) {
              uVar17 = (uint)*(ushort *)(plVar28 + 1);
              goto LAB_002aea21;
            }
          } while (-1 < lVar5);
        }
        if (puVar4 < puVar19) {
          tif->tif_rawcc = (long)puVar19 - (long)tif->tif_rawdata;
          iVar7 = TIFFFlushData1(tif);
          if (iVar7 == 0) goto LAB_002aea96;
          puVar19 = tif->tif_rawdata;
        }
        uVar23 = (ulong)uVar15;
        uVar22 = uVar22 << ((byte)uVar15 & 0x3f) | uVar8;
        lVar10 = lVar27 + uVar23 + -8;
        *puVar19 = (uint8_t)(uVar22 >> ((byte)lVar10 & 0x3f));
        if ((long)(lVar27 + uVar23) < 0x10) {
          puVar19 = puVar19 + 1;
        }
        else {
          lVar10 = lVar27 + uVar23 + -0x10;
          puVar19[1] = (uint8_t)(uVar22 >> ((byte)lVar10 & 0x3f));
          puVar19 = puVar19 + 2;
        }
        uVar13 = uVar6 + 1;
        *(short *)(plVar28 + 1) = (short)uVar6;
        *plVar28 = lVar26;
        if (uVar13 == 0xffe) {
          puVar9 = *(undefined8 **)(puVar3 + 0x120);
          puVar12 = puVar9 + 18000;
          uVar25 = 0x2329;
          do {
            puVar12[-0xe] = 0xffffffffffffffff;
            puVar12[-0xc] = 0xffffffffffffffff;
            puVar12[-10] = 0xffffffffffffffff;
            puVar12[-8] = 0xffffffffffffffff;
            puVar12[-6] = 0xffffffffffffffff;
            puVar12[-4] = 0xffffffffffffffff;
            puVar12[-2] = 0xffffffffffffffff;
            *puVar12 = 0xffffffffffffffff;
            puVar12 = puVar12 + -0x10;
            uVar25 = uVar25 - 8;
          } while (7 < uVar25);
LAB_002ae8a0:
          *puVar9 = 0xffffffffffffffff;
          puVar3[0x100] = '\0';
          puVar3[0x101] = '\0';
          puVar3[0x102] = '\0';
          puVar3[0x103] = '\0';
          puVar3[0x104] = '\0';
          puVar3[0x105] = '\0';
          puVar3[0x106] = '\0';
          puVar3[0x107] = '\0';
          uVar22 = uVar22 << ((byte)uVar15 & 0x3f) | 0x100;
          lVar21 = lVar10 + uVar23 + -8;
          *puVar19 = (uint8_t)(uVar22 >> ((byte)lVar21 & 0x3f));
          uVar15 = 9;
          uVar20 = 0x1ff;
          if ((long)(lVar10 + uVar23) < 0x10) {
            puVar19 = puVar19 + 1;
          }
          else {
            lVar21 = lVar10 + uVar23 + -0x10;
            puVar19[1] = (uint8_t)(uVar22 >> ((byte)lVar21 & 0x3f));
            puVar19 = puVar19 + 2;
          }
          lVar11 = 0;
          uVar25 = uVar23;
          lVar10 = lVar21;
          uVar6 = 0x102;
        }
        else {
          uVar25 = uVar25 + uVar23;
          if ((int)uVar6 < (int)uVar20) {
            uVar6 = uVar13;
            if (local_68 <= lVar11) {
              if (lVar21 + lVar14 < 0x7fffff) {
                lVar16 = lVar16 / (long)uVar25;
              }
              else {
                lVar16 = 0x7fffffff;
                if (0xff < uVar25) {
                  lVar16 = lVar11 / ((long)uVar25 >> 8);
                }
              }
              local_68 = lVar21 + lVar14 + 0x2711;
              if (lVar16 <= *(long *)(puVar3 + 0x100)) {
                puVar9 = *(undefined8 **)(puVar3 + 0x120);
                puVar12 = puVar9 + 18000;
                uVar25 = 0x2329;
                do {
                  puVar12[-0xe] = 0xffffffffffffffff;
                  puVar12[-0xc] = 0xffffffffffffffff;
                  puVar12[-10] = 0xffffffffffffffff;
                  puVar12[-8] = 0xffffffffffffffff;
                  puVar12[-6] = 0xffffffffffffffff;
                  puVar12[-4] = 0xffffffffffffffff;
                  puVar12[-2] = 0xffffffffffffffff;
                  *puVar12 = 0xffffffffffffffff;
                  puVar12 = puVar12 + -0x10;
                  uVar25 = uVar25 - 8;
                } while (7 < uVar25);
                goto LAB_002ae8a0;
              }
              *(long *)(puVar3 + 0x100) = lVar16;
            }
          }
          else {
            if (0xb < (int)uVar15) {
              __assert_fail("nbits <= BITS_MAX",
                            "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                            ,0x4e0,"int LZWEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
            }
            uVar15 = uVar15 + 1;
            uVar20 = ~(uint)(-1L << ((byte)uVar15 & 0x3f));
            uVar6 = uVar13;
          }
        }
LAB_002aea21:
        lVar21 = lVar11;
        lVar24 = cc - lVar14;
        cc = lVar24 + -1;
        local_80 = local_80 + lVar14 + 1;
        lVar27 = lVar10;
      } while (1 < lVar24);
    }
LAB_002aeac3:
    *(long *)(puVar3 + 0x108) = lVar21;
    *(ulong *)(puVar3 + 0x110) = uVar25;
    *(long *)(puVar3 + 0xf8) = local_68;
    *(uint *)(puVar3 + 0xf4) = uVar17 & 0xffff;
    *(ulong *)(puVar3 + 0x88) = uVar22;
    *(long *)(puVar3 + 0x90) = lVar10;
    *(short *)(puVar3 + 0x84) = (short)uVar6;
    *(short *)(puVar3 + 0x82) = (short)uVar20;
    *(short *)(puVar3 + 0x80) = (short)uVar15;
    tif->tif_rawcp = puVar19;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int LZWEncode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    register LZWCodecState *sp = EncoderState(tif);
    register long fcode;
    register hash_t *hp;
    register int h, c;
    hcode_t ent;
    long disp;
    tmsize_t incount, outcount, checkpoint;
    WordType nextdata;
    long nextbits;
    int free_ent, maxcode, nbits;
    uint8_t *op;
    uint8_t *limit;

    (void)s;
    if (sp == NULL)
        return (0);

    assert(sp->enc_hashtab != NULL);

    /*
     * Load local state.
     */
    incount = sp->enc_incount;
    outcount = sp->enc_outcount;
    checkpoint = sp->enc_checkpoint;
    nextdata = sp->lzw_nextdata;
    nextbits = sp->lzw_nextbits;
    free_ent = sp->lzw_free_ent;
    maxcode = sp->lzw_maxcode;
    nbits = sp->lzw_nbits;
    op = tif->tif_rawcp;
    limit = sp->enc_rawlimit;
    ent = (hcode_t)sp->enc_oldcode;

    if (ent == (hcode_t)-1 && cc > 0)
    {
        /*
         * NB: This is safe because it can only happen
         *     at the start of a strip where we know there
         *     is space in the data buffer.
         */
        PutNextCode(op, CODE_CLEAR);
        ent = *bp++;
        cc--;
        incount++;
    }
    while (cc > 0)
    {
        c = *bp++;
        cc--;
        incount++;
        fcode = ((long)c << BITS_MAX) + ent;
        h = (c << HSHIFT) ^ ent; /* xor hashing */
#ifdef _WINDOWS
        /*
         * Check hash index for an overflow.
         */
        if (h >= HSIZE)
            h -= HSIZE;
#endif
        hp = &sp->enc_hashtab[h];
        if (hp->hash == fcode)
        {
            ent = hp->code;
            continue;
        }
        if (hp->hash >= 0)
        {
            /*
             * Primary hash failed, check secondary hash.
             */
            disp = HSIZE - h;
            if (h == 0)
                disp = 1;
            do
            {
                /*
                 * Avoid pointer arithmetic because of
                 * wraparound problems with segments.
                 */
                if ((h -= disp) < 0)
                    h += HSIZE;
                hp = &sp->enc_hashtab[h];
                if (hp->hash == fcode)
                {
                    ent = hp->code;
                    goto hit;
                }
            } while (hp->hash >= 0);
        }
        /*
         * New entry, emit code and add to table.
         */
        /*
         * Verify there is space in the buffer for the code
         * and any potential Clear code that might be emitted
         * below.  The value of limit is setup so that there
         * are at least 4 bytes free--room for 2 codes.
         */
        if (op > limit)
        {
            tif->tif_rawcc = (tmsize_t)(op - tif->tif_rawdata);
            if (!TIFFFlushData1(tif))
                return 0;
            op = tif->tif_rawdata;
        }
        PutNextCode(op, ent);
        ent = (hcode_t)c;
        hp->code = (hcode_t)(free_ent++);
        hp->hash = fcode;
        if (free_ent == CODE_MAX - 1)
        {
            /* table is full, emit clear code and reset */
            cl_hash(sp);
            sp->enc_ratio = 0;
            incount = 0;
            outcount = 0;
            free_ent = CODE_FIRST;
            PutNextCode(op, CODE_CLEAR);
            nbits = BITS_MIN;
            maxcode = MAXCODE(BITS_MIN);
        }
        else
        {
            /*
             * If the next entry is going to be too big for
             * the code size, then increase it, if possible.
             */
            if (free_ent > maxcode)
            {
                nbits++;
                assert(nbits <= BITS_MAX);
                maxcode = (int)MAXCODE(nbits);
            }
            else if (incount >= checkpoint)
            {
                tmsize_t rat;
                /*
                 * Check compression ratio and, if things seem
                 * to be slipping, clear the hash table and
                 * reset state.  The compression ratio is a
                 * 24+8-bit fractional number.
                 */
                checkpoint = incount + CHECK_GAP;
                CALCRATIO(sp, rat);
                if (rat <= sp->enc_ratio)
                {
                    cl_hash(sp);
                    sp->enc_ratio = 0;
                    incount = 0;
                    outcount = 0;
                    free_ent = CODE_FIRST;
                    PutNextCode(op, CODE_CLEAR);
                    nbits = BITS_MIN;
                    maxcode = MAXCODE(BITS_MIN);
                }
                else
                    sp->enc_ratio = rat;
            }
        }
    hit:;
    }

    /*
     * Restore global state.
     */
    sp->enc_incount = incount;
    sp->enc_outcount = outcount;
    sp->enc_checkpoint = checkpoint;
    sp->enc_oldcode = ent;
    sp->lzw_nextdata = nextdata;
    sp->lzw_nextbits = nextbits;
    sp->lzw_free_ent = (unsigned short)free_ent;
    sp->lzw_maxcode = (unsigned short)maxcode;
    sp->lzw_nbits = (unsigned short)nbits;
    tif->tif_rawcp = op;
    return (1);
}